

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_concat(lua_State *L,int n)

{
  TValue *pTVar1;
  
  if (n < 2) {
    if (n == 0) {
      L->top->u64 = (L->glref).ptr64 + 0x78 | 0xfffd800000000000;
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
        lj_state_growstack1(L);
        return;
      }
    }
  }
  else {
    do {
      pTVar1 = lj_meta_cat(L,L->top + -1,1 - n);
      if (pTVar1 == (TValue *)0x0) {
        L->top = L->top + -(ulong)(n - 1U);
        return;
      }
      n = (n - 1U) - (int)((ulong)((long)L->top - (long)pTVar1) >> 3);
      L->top = pTVar1 + 2;
      lj_vm_call(L,pTVar1,2);
      pTVar1 = L->top;
      L->top = pTVar1 + -2;
      pTVar1[-3] = pTVar1[-1];
    } while (1 < n);
  }
  return;
}

Assistant:

LUA_API void lua_concat(lua_State *L, int n)
{
  lj_checkapi_slot(n);
  if (n >= 2) {
    n--;
    do {
      TValue *top = lj_meta_cat(L, L->top-1, -n);
      if (top == NULL) {
	L->top -= n;
	break;
      }
      n -= (int)(L->top - top);
      L->top = top+2;
      lj_vm_call(L, top, 1+1);
      L->top -= 1+LJ_FR2;
      copyTV(L, L->top-1, L->top+LJ_FR2);
    } while (--n > 0);
  } else if (n == 0) {  /* Push empty string. */
    setstrV(L, L->top, &G(L)->strempty);
    incr_top(L);
  }
  /* else n == 1: nothing to do. */
}